

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextElement.cpp
# Opt level: O1

void __thiscall KDReports::TextElement::build(TextElement *this,ReportBuilder *builder)

{
  double dVar1;
  TextElementPrivate *pTVar2;
  long lVar3;
  int pos;
  int iVar4;
  QArrayData *d;
  QTextCharFormat charFormat;
  anon_union_24_3_e3d07ef4_for_data local_88;
  QTextCharFormat local_68 [16];
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  TextDocumentData::aboutToModifyContents(builder->m_contentDocument,Append);
  pos = QTextCursor::position();
  QTextCursor::charFormat();
  cleanupVariableProperties(local_68);
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (pTVar2->m_fontSet == true) {
    QTextCharFormat::setFont((QFont *)local_68,(int)pTVar2 + 0x70);
  }
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (pTVar2->m_boldIsSet == true) {
    iVar4 = 400;
    if (pTVar2->m_bold != false) {
      iVar4 = 700;
    }
    QVariant::QVariant((QVariant *)&local_88,iVar4);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x2003);
    QVariant::~QVariant((QVariant *)&local_88);
  }
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (pTVar2->m_italicIsSet == true) {
    QVariant::QVariant((QVariant *)&local_88,pTVar2->m_italic);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x2004);
    QVariant::~QVariant((QVariant *)&local_88);
  }
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (pTVar2->m_underlineIsSet == true) {
    QVariant::QVariant((QVariant *)&local_88,(uint)pTVar2->m_underline);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x2023);
    QVariant::~QVariant((QVariant *)&local_88);
  }
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (pTVar2->m_strikeoutIsSet == true) {
    QVariant::QVariant((QVariant *)&local_88,pTVar2->m_strikeout);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x2007);
    QVariant::~QVariant((QVariant *)&local_88);
  }
  dVar1 = ((this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl)->m_pointSize
  ;
  if (0.0 < dVar1) {
    QVariant::QVariant((QVariant *)&local_88,dVar1);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x2001);
    QVariant::~QVariant((QVariant *)&local_88);
  }
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  lVar3 = *(qsizetype *)((long)&(pTVar2->m_fontFamily).d + 0x10);
  if (lVar3 != 0) {
    local_40.d = (pTVar2->m_fontFamily).d.d;
    local_40.ptr = *(char16_t **)((long)&(pTVar2->m_fontFamily).d + 8);
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_40.size = lVar3;
    local_58.ptr = (QString *)
                   QArrayData::allocate((QArrayData **)&local_88.shared,0x18,8,1,KeepSize);
    local_58.d = (Data *)local_88.shared;
    local_58.size = 0;
    QtPrivate::QGenericArrayOps<QString>::copyAppend
              ((QGenericArrayOps<QString> *)&local_58,(QString *)&local_40,
               (QString *)&stack0xffffffffffffffd8);
    QVariant::QVariant((QVariant *)&local_88,(QList *)&local_58);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x1fe7);
    QVariant::~QVariant((QVariant *)&local_88);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  }
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if ((pTVar2->m_foreground).cspec == Invalid) {
    QTextFormat::clearProperty((int)local_68);
  }
  else {
    QBrush::QBrush((QBrush *)&local_58,&pTVar2->m_foreground,SolidPattern);
    QBrush::operator_cast_to_QVariant((QVariant *)&local_88,(QBrush *)&local_58);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x821);
    QVariant::~QVariant((QVariant *)&local_88);
    QBrush::~QBrush((QBrush *)&local_58);
  }
  Element::background((Element *)&local_88);
  iVar4 = *(int *)(local_88.shared + 4);
  QBrush::~QBrush((QBrush *)local_88.data);
  if (iVar4 == 0) {
    QTextFormat::clearProperty((int)local_68);
  }
  else {
    Element::background((Element *)&local_58);
    QBrush::operator_cast_to_QVariant((QVariant *)&local_88,(QBrush *)&local_58);
    QTextFormat::setProperty((int)local_68,(QVariant *)0x820);
    QVariant::~QVariant((QVariant *)&local_88);
    QBrush::~QBrush((QBrush *)&local_58);
  }
  QTextCursor::setCharFormat((QTextCharFormat *)&builder->m_cursor);
  QTextCursor::insertText((QString *)&builder->m_cursor);
  pTVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (*(qsizetype *)((long)&(pTVar2->m_id).d + 0x10) != 0) {
    TextDocumentData::setTextValueMarker
              (builder->m_contentDocument,pos,&pTVar2->m_id,
               *(int *)((long)&(pTVar2->m_string).d + 0x10),false);
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  return;
}

Assistant:

void KDReports::TextElement::build(ReportBuilder &builder) const
{
    QTextCursor &cursor = builder.cursor();
    const int charPosition = cursor.position();
    QTextCharFormat charFormat = cursor.charFormat();
    KDReports::cleanupVariableProperties(charFormat);
    if (d->m_fontSet) {
#if QT_VERSION >= QT_VERSION_CHECK(5, 3, 0)
        charFormat.setFont(d->m_font, QTextCharFormat::FontPropertiesSpecifiedOnly);
#else
        charFormat.setFont(d->m_font);
#endif
    }
    if (d->m_boldIsSet)
        charFormat.setFontWeight(d->m_bold ? QFont::Bold : QFont::Normal);
    if (d->m_italicIsSet)
        charFormat.setFontItalic(d->m_italic);
    if (d->m_underlineIsSet)
        charFormat.setFontUnderline(d->m_underline);
    if (d->m_strikeoutIsSet)
        charFormat.setFontStrikeOut(d->m_strikeout);
    if (d->m_pointSize > 0)
        charFormat.setFontPointSize(d->m_pointSize);
    if (!d->m_fontFamily.isEmpty())
#if QT_VERSION >= QT_VERSION_CHECK(6, 1, 0)
        charFormat.setFontFamilies({d->m_fontFamily});
#else
        charFormat.setFontFamily(d->m_fontFamily);
#endif
    if (d->m_foreground.isValid())
        charFormat.setForeground(d->m_foreground);
    else
        charFormat.clearForeground();
    if (background().style() != Qt::NoBrush)
        charFormat.setBackground(background());
    else
        charFormat.clearBackground();
    cursor.setCharFormat(charFormat);
    cursor.insertText(d->m_string);
    if (!d->m_id.isEmpty())
        builder.currentDocumentData().setTextValueMarker(charPosition, d->m_id, d->m_string.length(), false);
}